

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall
cmCacheManager::WritePropertyEntries
          (cmCacheManager *this,ostream *os,string *entryKey,CacheEntry *e,cmMessenger *messenger)

{
  char *pcVar1;
  cmValue value;
  long lVar2;
  char *p;
  cmMessenger *local_e8;
  CacheEntry *local_e0;
  long local_d8;
  cmAlphaNum local_d0;
  string key;
  cmAlphaNum local_80;
  string helpstring;
  
  local_e8 = messenger;
  local_e0 = e;
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 8) {
    p = *(char **)((long)PersistentProperties + lVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,p,(allocator<char> *)&local_d0);
    value = CacheEntry::GetProperty(local_e0,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    pcVar1 = p;
    if (value.Value != (string *)0x0) {
      local_d8 = lVar2;
      local_80.View_._M_len = strlen(p);
      local_80.View_._M_str = pcVar1;
      local_d0.View_._M_len = 0x18;
      local_d0.View_._M_str = " property for variable: ";
      cmStrCat<std::__cxx11::string>(&helpstring,&local_80,&local_d0,entryKey);
      OutputHelpString(os,&helpstring);
      local_80.View_._M_str = (entryKey->_M_dataplus)._M_p;
      local_80.View_._M_len = entryKey->_M_string_length;
      local_d0.View_._M_len = 1;
      local_d0.View_._M_str = local_d0.Digits_;
      local_d0.Digits_[0] = '-';
      cmStrCat<char_const*>(&key,&local_80,&local_d0,&p);
      OutputKey(os,&key);
      lVar2 = local_d8;
      std::operator<<(os,":INTERNAL=");
      OutputValue(os,value.Value);
      std::operator<<(os,'\n');
      OutputNewlineTruncationWarning(os,&key,value.Value,local_e8);
      std::__cxx11::string::~string((string *)&key);
      std::__cxx11::string::~string((string *)&helpstring);
    }
  }
  return;
}

Assistant:

void cmCacheManager::WritePropertyEntries(std::ostream& os,
                                          const std::string& entryKey,
                                          const CacheEntry& e,
                                          cmMessenger* messenger) const
{
  for (const char* p : cmCacheManager::PersistentProperties) {
    if (cmValue value = e.GetProperty(p)) {
      std::string helpstring =
        cmStrCat(p, " property for variable: ", entryKey);
      cmCacheManager::OutputHelpString(os, helpstring);

      std::string key = cmStrCat(entryKey, '-', p);
      cmCacheManager::OutputKey(os, key);
      os << ":INTERNAL=";
      cmCacheManager::OutputValue(os, *value);
      os << '\n';
      cmCacheManager::OutputNewlineTruncationWarning(os, key, *value,
                                                     messenger);
    }
  }
}